

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# status.cc
# Opt level: O2

Status absl::lts_20250127::ErrnoToStatus(int error_number,string_view message)

{
  StatusCode code;
  undefined4 in_register_0000003c;
  AlphaNum *in_R8;
  string_view msg;
  string local_f8;
  string local_d8;
  AlphaNum local_b8;
  AlphaNum local_88;
  char *local_58 [6];
  
  local_58[0] = message._M_str;
  local_88.piece_ = NullSafeStringView(": ");
  base_internal::StrError_abi_cxx11_
            (&local_d8,(base_internal *)(message._M_len & 0xffffffff),(int)local_88.piece_._M_str);
  local_b8.piece_._M_len = local_d8._M_string_length;
  local_b8.piece_._M_str = local_d8._M_dataplus._M_p;
  StrCat_abi_cxx11_(&local_f8,(lts_20250127 *)local_58,&local_88,&local_b8,in_R8);
  code = ErrnoToStatusCode((int)message._M_len);
  std::__cxx11::string::~string((string *)&local_d8);
  msg._M_str = local_f8._M_dataplus._M_p;
  msg._M_len = local_f8._M_string_length;
  Status::Status((Status *)CONCAT44(in_register_0000003c,error_number),code,msg);
  std::__cxx11::string::~string((string *)&local_f8);
  return (Status)(uintptr_t)CONCAT44(in_register_0000003c,error_number);
}

Assistant:

Status ErrnoToStatus(int error_number, absl::string_view message) {
  return Status(ErrnoToStatusCode(error_number),
                MessageForErrnoToStatus(error_number, message));
}